

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_pgen_chunk.cpp
# Opt level: O2

void __thiscall sf2cute::SFRIFFPgenChunk::SFRIFFPgenChunk(SFRIFFPgenChunk *this)

{
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface =
       (_func_int **)&PTR__SFRIFFPgenChunk_0011dc00;
  (this->instrument_index_map_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->instrument_index_map_)._M_h._M_bucket_count = 0;
  this->size_ = 0;
  this->presets_ =
       (vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
        *)0x0;
  *(undefined8 *)&(this->instrument_index_map_)._M_h._M_rehash_policy = 0;
  (this->instrument_index_map_)._M_h._M_buckets =
       &(this->instrument_index_map_)._M_h._M_single_bucket;
  (this->instrument_index_map_)._M_h._M_bucket_count = 1;
  (this->instrument_index_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->instrument_index_map_)._M_h._M_element_count = 0;
  (this->instrument_index_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->instrument_index_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->instrument_index_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SFRIFFPgenChunk::SFRIFFPgenChunk() :
    size_(0),
    presets_(nullptr),
    instrument_index_map_() {
}